

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagnosticsReporter_TypeCanonicalizer.cpp
# Opt level: O3

void __thiscall
psy::C::TypeCanonicalizer::DiagnosticsReporter::TagTypeDoesNotMatchTagDeclaration
          (DiagnosticsReporter *this,SyntaxToken *tk)

{
  long *local_130 [2];
  long local_120 [2];
  long *local_110 [2];
  long local_100 [2];
  long *local_f0 [2];
  long local_e0 [2];
  DiagnosticDescriptor local_d0;
  SyntaxToken local_68;
  
  local_f0[0] = local_e0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_f0,ID_of_TagTypeDoesNotMatchTagDeclaration_abi_cxx11_._M_dataplus._M_p,
             ID_of_TagTypeDoesNotMatchTagDeclaration_abi_cxx11_._M_dataplus._M_p +
             ID_of_TagTypeDoesNotMatchTagDeclaration_abi_cxx11_._M_string_length);
  local_110[0] = local_100;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_110,"[[tag does not match declaration]]","");
  local_130[0] = local_120;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_130,"tag does not match declaration","");
  psy::DiagnosticDescriptor::DiagnosticDescriptor(&local_d0,local_f0,local_110,local_130,2,3);
  local_68.field_10 = tk->field_10;
  local_68.tree_ = tk->tree_;
  local_68.syntaxK_ = tk->syntaxK_;
  local_68.byteSize_ = tk->byteSize_;
  local_68.charSize_ = tk->charSize_;
  local_68._14_2_ = *(undefined2 *)&tk->field_0xe;
  local_68.byteOffset_ = tk->byteOffset_;
  local_68.charOffset_ = tk->charOffset_;
  local_68.matchingBracket_ = tk->matchingBracket_;
  local_68.field_7 = tk->field_7;
  local_68._34_2_ = *(undefined2 *)&tk->field_0x22;
  local_68.lineno_ = tk->lineno_;
  local_68.column_ = tk->column_;
  local_68._44_4_ = *(undefined4 *)&tk->field_0x2c;
  diagnose(this,&local_d0,&local_68);
  SyntaxToken::~SyntaxToken(&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.description_._M_dataplus._M_p != &local_d0.description_.field_2) {
    operator_delete(local_d0.description_._M_dataplus._M_p,
                    local_d0.description_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.title_._M_dataplus._M_p != &local_d0.title_.field_2) {
    operator_delete(local_d0.title_._M_dataplus._M_p,
                    local_d0.title_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.id_._M_dataplus._M_p != &local_d0.id_.field_2) {
    operator_delete(local_d0.id_._M_dataplus._M_p,local_d0.id_.field_2._M_allocated_capacity + 1);
  }
  if (local_130[0] != local_120) {
    operator_delete(local_130[0],local_120[0] + 1);
  }
  if (local_110[0] != local_100) {
    operator_delete(local_110[0],local_100[0] + 1);
  }
  if (local_f0[0] != local_e0) {
    operator_delete(local_f0[0],local_e0[0] + 1);
  }
  return;
}

Assistant:

void TypeCanonicalizer::DiagnosticsReporter::TagTypeDoesNotMatchTagDeclaration(SyntaxToken tk)
{
    diagnose(DiagnosticDescriptor(
                 ID_of_TagTypeDoesNotMatchTagDeclaration,
                 "[[tag does not match declaration]]",
                 "tag does not match declaration",
                 DiagnosticSeverity::Error,
                 DiagnosticCategory::TypeResolution),
             tk);
}